

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::insert
          (SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs> *this,BindingMap *svBindings
          ,LeafData *ld)

{
  int *piVar1;
  UnresolvedSplitRecord *pUVar2;
  UnresolvedSplitRecord *pUVar3;
  long lVar4;
  anon_union_4_2_6ecd024b_for_Entry_0 aVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  undefined4 uVar8;
  TermList TVar9;
  BindingMap *pBVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  Node *pNVar15;
  undefined4 extraout_var;
  Node *pNVar16;
  undefined4 extraout_var_00;
  Entry *pEVar17;
  Node **leaf;
  Term *t;
  ulong uVar18;
  ItemIteratorCore *this_00;
  anon_union_4_2_6ecd024b_for_Entry_0 *paVar19;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  Entry *pEVar20;
  TermList *term_2;
  TermList *this_01;
  uint64_t *puVar21;
  Node **leaf_00;
  TermList *pTVar22;
  int iVar23;
  uint *var;
  TermList *pTVar24;
  bool bVar25;
  anon_class_16_2_f84bbffd f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_f84bbffd f_01;
  anon_class_16_2_f84bbffd f_02;
  Top TVar26;
  Stack<Kernel::TermList_*> subterms;
  TermList term;
  uint boundVar;
  uint boundVar_1;
  Stack<Kernel::TermList_*> local_1a8;
  TermList local_180;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
  *local_178;
  BindingMap *local_170;
  Node **local_168;
  undefined4 local_15c;
  long local_158;
  uint64_t uStack_150;
  FixedSizeAllocator<32UL> *local_148;
  SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs> *local_140;
  ulong local_138 [6];
  undefined4 local_108;
  ulong local_f8 [6];
  undefined4 local_c8;
  undefined1 local_c0 [24];
  Entry *local_a8;
  Entry *pEStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  ulong local_68 [6];
  undefined4 local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  leaf_00 = &this->_root;
  local_178 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
               *)ld;
  local_140 = this;
  if (this->_root == (Node *)0x0) {
    if (svBindings->_size == 0) {
      pNVar15 = (Node *)::Lib::FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      (pNVar15->_term)._content = 2;
      pNVar15->_vptr_Node = (_func_int **)&PTR__UListLeaf_00b5aa08;
      pNVar15[1]._vptr_Node = (_func_int **)0x0;
      *(undefined4 *)&pNVar15[1]._term._content = 0;
      local_38 = 0;
      local_68[4] = 0;
      local_68[5] = 0;
      local_68[2] = 0;
      local_68[3] = 0;
      local_68[1] = 0;
      local_68[0] = (ulong)*(byte *)&(((SelectedEquality *)
                                      &local_178->
                                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                      )->_inner)._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                     .
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                     .
                                     super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                    & 0xffffffffffffff03;
      f_02.other = local_178;
      f_02.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                   *)local_68;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_68,f_02);
      (*pNVar15->_vptr_Node[9])
                (pNVar15,(RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                          *)local_68);
      *leaf_00 = pNVar15;
      return;
    }
    local_1a8._capacity = (size_t)svBindings->_entries;
    local_1a8._stack = (TermList **)svBindings->_afterLast;
    local_1a8._cursor = (TermList **)CONCAT44(local_1a8._cursor._4_4_,svBindings->_timestamp);
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::Iterator::
    hasNext((Iterator *)&local_1a8);
    uVar14 = *(uint *)(local_1a8._capacity + 4);
    local_1a8._capacity = (size_t)(local_1a8._capacity + 0x10);
    pNVar15 = (Node *)::Lib::FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)
                                 (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    (pNVar15->_term)._content = 2;
    *(uint *)&pNVar15[1]._vptr_Node = uVar14;
    pNVar15->_vptr_Node = (_func_int **)&PTR__UArrIntermediateNode_00b5aba8;
    *(undefined4 *)((long)&pNVar15[1]._vptr_Node + 4) = 0;
    pNVar15[1]._term._content = 0;
    *leaf_00 = pNVar15;
  }
  if (svBindings->_size == 0) {
    ensureLeafEfficiency((Leaf **)leaf_00);
    pNVar15 = *leaf_00;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    pEStack_a0 = (Entry *)0x0;
    local_78 = 0;
    local_a8 = (Entry *)((ulong)*(byte *)&(((SelectedEquality *)
                                           &local_178->
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                           )->_inner)._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                          .
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                          .
                                          super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                        & 0xffffffffffffff03);
    f_01.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
                  *)local_178;
    f_01.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
                 *)&local_a8;
    ::Lib::CoproductImpl::
    RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>const&)::_lambda(auto:1)_1_>
              ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                *)&local_a8,f_01);
    (*pNVar15->_vptr_Node[9])
              (pNVar15,(RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                        *)&local_a8);
  }
  else {
    if (insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::SuperpositionConf::Lhs)
        ::unresolvedSplits == '\0') {
      insert();
    }
    insert::unresolvedSplits._size = 0;
    local_148 = (FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48);
    local_170 = svBindings;
    do {
      iVar12 = (*((Node *)&(*leaf_00)->_vptr_Node)->_vptr_Node[2])();
      if ((char)iVar12 == '\0') {
        iVar12 = (*((Node *)&(*leaf_00)->_vptr_Node)->_vptr_Node[5])();
        iVar23 = 0;
        bVar11 = false;
        if (iVar12 != 1) goto LAB_0037aa39;
        pNVar15 = *leaf_00;
        iVar12 = (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[4])(pNVar15);
        pBVar10 = local_170;
        bVar11 = iVar12 == 1;
        if (bVar11) {
          local_158 = CONCAT44(local_158._4_4_,
                               *(undefined4 *)&((Node *)&pNVar15[1]._vptr_Node)->_vptr_Node);
          pNVar16 = (Node *)pNVar15[1]._term._content;
          pEVar17 = ::Lib::
                    DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
                    findEntry(local_170,(uint *)&local_158);
          if (pEVar17 == (Entry *)0x0) {
            uVar18 = (pNVar16->_term)._content;
            bVar25 = true;
            if ((uVar18 & 3) == 0) {
              bVar25 = (bool)((*(byte *)(uVar18 + 0x28) & 8) >> 3);
              bVar11 = bVar25 != false && bVar11;
            }
          }
          else {
            local_1a8._capacity = CONCAT44(local_1a8._capacity._4_4_,(uint)local_158);
            pEVar17 = ::Lib::
                      DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
                      findEntry(pBVar10,(uint *)&local_1a8);
            local_1a8._capacity = (pEVar17->_val)._content;
            TVar26 = Kernel::TermList::top((TermList *)&local_1a8);
            iVar12 = (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[10])
                               (pNVar15,TVar26._inner._inner._0_8_,
                                (ulong)(TVar26._inner._inner._8_4_ & 0xff),0);
            bVar25 = CONCAT44(extraout_var,iVar12) == 0;
          }
          iVar23 = 0;
          if (bVar25 != false) {
            uVar14 = *(uint *)&((Node *)&pNVar15[1]._vptr_Node)->_vptr_Node;
            uVar6 = (pNVar16->_term)._content;
            if (insert::unresolvedSplits._capacity == insert::unresolvedSplits._size) {
              ::Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              ::expand(&insert::unresolvedSplits);
            }
            pUVar3 = insert::unresolvedSplits._data1;
            uVar13 = insert::unresolvedSplits._size + 1;
            insert::unresolvedSplits._size = uVar13;
            insert::unresolvedSplits._data1[uVar13].var = uVar14;
            pUVar3[uVar13].original._content = uVar6;
            ::Lib::
            BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
            ::bubbleUp(&insert::unresolvedSplits,insert::unresolvedSplits._size);
            (pNVar16->_term)._content = (pNVar15->_term)._content;
            *leaf_00 = pNVar16;
            (pNVar15->_term)._content = 2;
            (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[0xc])(pNVar15);
            (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[1])(pNVar15);
            iVar23 = 2;
          }
        }
        leaf = leaf_00;
        if (iVar23 == 0) goto LAB_0037aa39;
      }
      else {
        bVar11 = false;
LAB_0037aa39:
        if (insert::unresolvedSplits._size != 0 && !bVar11) {
          do {
            pUVar3 = insert::unresolvedSplits._data;
            uVar14 = (insert::unresolvedSplits._data)->var;
            local_168 = (Node **)((insert::unresolvedSplits._data)->original)._content;
            uVar13 = insert::unresolvedSplits._size - 1;
            insert::unresolvedSplits._size = uVar13;
            if (uVar13 != 0) {
              local_1a8._capacity = *(size_t *)insert::unresolvedSplits._data;
              local_1a8._stack = (TermList **)((insert::unresolvedSplits._data)->original)._content;
              pUVar2 = insert::unresolvedSplits._data + uVar13;
              uVar8 = *(undefined4 *)&pUVar2->field_0x4;
              uVar6 = (pUVar2->original)._content;
              pUVar3->var = pUVar2->var;
              *(undefined4 *)&pUVar3->field_0x4 = uVar8;
              (pUVar3->original)._content = uVar6;
              pUVar3 = pUVar3 + uVar13;
              *(size_t *)pUVar3 = local_1a8._capacity;
              (pUVar3->original)._content = (uint64_t)local_1a8._stack;
              ::Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              ::bubbleDown(&insert::unresolvedSplits,1);
            }
            pNVar15 = *leaf_00;
            uVar6 = (pNVar15->_term)._content;
            pNVar16 = (Node *)::Lib::FixedSizeAllocator<64UL>::alloc
                                        ((FixedSizeAllocator<64UL> *)
                                         (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
            (pNVar16->_term)._content = uVar6;
            *(uint *)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node = uVar14;
            ((Node *)&pNVar16->_vptr_Node)->_vptr_Node =
                 (_func_int **)&PTR__UArrIntermediateNode_00b5aba8;
            *(undefined4 *)((long)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node + 4) = 0;
            pNVar16[1]._term._content = 0;
            (pNVar15->_term)._content = (uint64_t)local_168;
            *leaf_00 = pNVar16;
            TVar26 = Kernel::TermList::top(&pNVar15->_term);
            iVar12 = (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[10])
                               (pNVar16,TVar26._inner._inner._0_8_,
                                (ulong)(TVar26._inner._inner._8_4_ & 0xff),1);
            *(Node **)CONCAT44(extraout_var_00,iVar12) = pNVar15;
          } while (insert::unresolvedSplits._size != 0);
        }
        pBVar10 = local_170;
        pNVar15 = *leaf_00;
        local_15c = *(undefined4 *)&((Node *)&pNVar15[1]._vptr_Node)->_vptr_Node;
        local_1a8._capacity = CONCAT44(local_1a8._capacity._4_4_,local_15c);
        pEVar17 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                  ::findEntry(local_170,(uint *)&local_1a8);
        local_180._content = (pEVar17->_val)._content;
        ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   local_c0,(char *)pBVar10);
        this_01 = &local_180;
        TVar26 = Kernel::TermList::top(this_01);
        iVar12 = (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[10])
                           (pNVar15,TVar26._inner._inner._0_8_,
                            (ulong)(TVar26._inner._inner._8_4_ & 0xff),1);
        leaf = (Node **)CONCAT44(extraout_var_01,iVar12);
        if (*leaf == (Node *)0x0) {
          local_1a8._capacity = 0;
          local_1a8._stack = (TermList **)0x0;
          local_1a8._cursor = (TermList **)0x0;
          local_168 = leaf_00;
          this_00 = (ItemIteratorCore *)::operator_new(0x28);
          (this_00->super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
          _refCnt = 0;
          (this_00->super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
          _vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b542a0;
          pEVar17 = local_170->_afterLast;
          (this_00->_base)._next = local_170->_entries;
          (this_00->_base)._last = pEVar17;
          (this_00->_base)._timestamp = local_170->_timestamp;
          (this_00->super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
          _refCnt = 1;
          bVar11 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                   ::ItemIteratorCore::hasNext(this_00);
          uVar14 = (uint)bVar11;
          if (bVar11) {
            iVar12 = (*(this_00->
                       super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                       )._vptr_IteratorCore[3])(this_00);
            paVar19 = (anon_union_4_2_6ecd024b_for_Entry_0 *)CONCAT44(extraout_var_02,iVar12);
            puVar21 = extraout_RDX;
          }
          else {
            puVar21 = (uint64_t *)0x0;
            paVar19 = (anon_union_4_2_6ecd024b_for_Entry_0 *)0x0;
          }
          while ((char)uVar14 != '\0') {
            aVar5 = *paVar19;
            uVar6 = *puVar21;
            if (local_1a8._capacity._4_4_ == (int)local_1a8._capacity) {
              ::Lib::
              BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              ::expand((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                        *)&local_1a8);
            }
            uVar14 = (int)local_1a8._capacity + 1;
            local_1a8._capacity = CONCAT44(local_1a8._capacity._4_4_,uVar14);
            ((Entry *)((long)local_1a8._cursor + (ulong)uVar14 * 0x10))->field_0 = aVar5;
            (((Entry *)((long)local_1a8._cursor + (ulong)uVar14 * 0x10))->_val)._content = uVar6;
            if (1 < uVar14) {
              uVar18 = (ulong)uVar14;
              do {
                uVar18 = uVar18 >> 1;
                if ((uint)((Entry *)((long)local_1a8._cursor + (ulong)uVar14 * 0x10))->field_0 <=
                    (uint)((Entry *)((long)local_1a8._cursor + uVar18 * 0x10))->field_0) break;
                pEVar17 = (Entry *)((long)local_1a8._cursor + (ulong)uVar14 * 0x10);
                pEVar20 = (Entry *)((long)local_1a8._cursor + uVar18 * 0x10);
                local_158._0_4_ = *(uint *)&pEVar17->field_0;
                local_158._4_4_ = pEVar17->_key;
                uStack_150 = (pEVar17->_val)._content;
                uVar13 = pEVar20->_key;
                uVar6 = (pEVar20->_val)._content;
                pEVar17->field_0 = pEVar20->field_0;
                pEVar17->_key = uVar13;
                (pEVar17->_val)._content = uVar6;
                pEVar20->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)(uint)local_158;
                pEVar20->_key = local_158._4_4_;
                (pEVar20->_val)._content = uStack_150;
                bVar11 = 3 < uVar14;
                uVar14 = (uint)uVar18;
              } while (bVar11);
            }
            uVar14 = (*(this_00->
                       super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                       )._vptr_IteratorCore[2])(this_00);
            if ((char)uVar14 != '\0') {
              iVar12 = (*(this_00->
                         super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                         )._vptr_IteratorCore[3])(this_00);
              paVar19 = (anon_union_4_2_6ecd024b_for_Entry_0 *)CONCAT44(extraout_var_03,iVar12);
              puVar21 = extraout_RDX_00;
            }
          }
          piVar1 = &(this_00->
                    super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
                    _refCnt;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (*(this_00->
              super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
              _vptr_IteratorCore[1])(this_00);
          }
          while (TVar9._content = local_180._content, (int)local_1a8._capacity != 0) {
            aVar5 = *(anon_union_4_2_6ecd024b_for_Entry_0 *)local_1a8._stack;
            uVar6 = ((TermList *)((long)local_1a8._stack + 8))->_content;
            uVar14 = (int)local_1a8._capacity - 1;
            local_1a8._capacity = CONCAT44(local_1a8._capacity._4_4_,uVar14);
            if (uVar14 != 0) {
              local_158 = (long)*local_1a8._stack;
              uStack_150 = ((TermList *)((long)local_1a8._stack + 8))->_content;
              uVar7 = (((Entry *)((long)local_1a8._stack + (ulong)uVar14 * 0x10))->_val)._content;
              *local_1a8._stack =
                   (TermList *)*(long *)((long)local_1a8._stack + (ulong)uVar14 * 0x10);
              ((TermList *)((long)local_1a8._stack + 8))->_content = uVar7;
              pEVar17 = (Entry *)((long)local_1a8._stack + (ulong)uVar14 * 0x10);
              pEVar17->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)(int)local_158;
              pEVar17->_key = (int)((ulong)local_158 >> 0x20);
              (pEVar17->_val)._content = uStack_150;
              ::Lib::
              BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              ::bubbleDown((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                            *)&local_1a8,1);
            }
            TVar9._content = local_180._content;
            pNVar15 = (Node *)::Lib::FixedSizeAllocator<64UL>::alloc
                                        ((FixedSizeAllocator<64UL> *)
                                         (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
            (pNVar15->_term)._content = TVar9._content;
            *(anon_union_4_2_6ecd024b_for_Entry_0 *)&((Node *)&pNVar15[1]._vptr_Node)->_vptr_Node =
                 aVar5;
            ((Node *)&pNVar15->_vptr_Node)->_vptr_Node =
                 (_func_int **)&PTR__UArrIntermediateNode_00b5aba8;
            *(undefined4 *)((long)&((Node *)&pNVar15[1]._vptr_Node)->_vptr_Node + 4) = 0;
            pNVar15[1]._term._content = 0;
            *leaf = pNVar15;
            local_180._content = uVar6;
            TVar26 = Kernel::TermList::top(&local_180);
            iVar12 = (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[10])
                               (pNVar15,TVar26._inner._inner._0_8_,
                                (ulong)(TVar26._inner._inner._8_4_ & 0xff),1);
            leaf = (Node **)CONCAT44(extraout_var_04,iVar12);
          }
          pNVar15 = (Node *)::Lib::FixedSizeAllocator<32UL>::alloc(local_148);
          (pNVar15->_term)._content = TVar9._content;
          ((Node *)&pNVar15->_vptr_Node)->_vptr_Node = (_func_int **)&PTR__UListLeaf_00b5aa08;
          ((Node *)&pNVar15[1]._vptr_Node)->_vptr_Node = (_func_int **)0x0;
          *(undefined4 *)&pNVar15[1]._term._content = 0;
          *leaf = pNVar15;
          local_108 = 0;
          local_138[4] = 0;
          local_138[5] = 0;
          local_138[2] = 0;
          local_138[3] = 0;
          local_138[1] = 0;
          local_138[0] = (ulong)*(byte *)&(((SelectedEquality *)
                                           &local_178->
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                           )->_inner)._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                          .
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                          .
                                          super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                         & 0xffffffffffffff03;
          f_00.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
                        *)local_178;
          f_00.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
                       *)local_138;
          ::Lib::CoproductImpl::
          RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                      *)local_138,f_00);
          (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[9])(pNVar15,local_138);
          ensureIntermediateNodeEfficiency((IntermediateNode **)local_168);
          ::Lib::
          BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
          ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                         *)&local_1a8);
          iVar23 = 1;
        }
        else {
          pTVar22 = &(*leaf)->_term;
          local_1a8._capacity = 0x40;
          local_1a8._stack = (TermList **)::operator_new(0x200,0x10);
          local_1a8._end =
               (TermList **)(&((Entry *)local_1a8._stack)->field_0 + local_1a8._capacity * 2);
          local_1a8._cursor = (TermList **)(Entry *)local_1a8._stack;
LAB_0037abbe:
          while( true ) {
            if ((this_01->_content == pTVar22->_content) ||
               (bVar11 = Kernel::TermList::sameTop
                                   ((TermList)pTVar22->_content,(TermList)this_01->_content),
               !bVar11)) break;
            t = (Term *)pTVar22->_content;
            uVar6 = this_01->_content;
            if ((t->_args[0]._content & 8) != 0) {
              t = Kernel::Term::cloneNonShared(t);
              pTVar22->_content = (uint64_t)t;
            }
            uVar18 = (ulong)(*(uint *)&t->field_0xc & 0xfffffff);
            pTVar22 = t->_args + uVar18;
            lVar4 = uVar6 + (ulong)(*(uint *)(uVar6 + 0xc) & 0xfffffff) * 8;
            this_01 = (TermList *)(lVar4 + 0x28);
            if ((t->_args[uVar18 - 1]._content & 3) != 2) {
              if (local_1a8._cursor == local_1a8._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_1a8);
              }
              *local_1a8._cursor = t->_args + (uVar18 - 1);
              local_1a8._cursor = (TermList **)((long)local_1a8._cursor + 8);
              pTVar24 = (TermList *)(lVar4 + 0x20);
              if (local_1a8._cursor == local_1a8._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_1a8);
              }
              goto LAB_0037ad87;
            }
          }
          bVar11 = Kernel::TermList::sameTop
                             ((TermList)pTVar22->_content,(TermList)this_01->_content);
          if (!bVar11) {
            uVar18 = pTVar22->_content;
            if ((~(uint)uVar18 & 3) == 0) {
              uVar14 = (uint)(uVar18 >> 2);
            }
            else {
              uVar14 = local_140->_nextVar;
              local_140->_nextVar = uVar14 + 1;
              if (insert::unresolvedSplits._capacity == insert::unresolvedSplits._size) {
                ::Lib::
                BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
                ::expand(&insert::unresolvedSplits);
              }
              pUVar3 = insert::unresolvedSplits._data1;
              uVar13 = insert::unresolvedSplits._size + 1;
              insert::unresolvedSplits._size = uVar13;
              insert::unresolvedSplits._data1[uVar13].var = uVar14;
              pUVar3[uVar13].original._content = uVar18;
              ::Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              ::bubbleUp(&insert::unresolvedSplits,insert::unresolvedSplits._size);
              pTVar22->_content = (ulong)(uVar14 * 4 + 3);
            }
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      (pBVar10,uVar14,(TermList)this_01->_content);
          }
          if (local_1a8._cursor != local_1a8._stack) goto code_r0x0037ad20;
          iVar23 = 2;
          if (pBVar10->_size == 0) {
            ensureLeafEfficiency((Leaf **)leaf);
            pNVar15 = *leaf;
            local_f8[4] = 0;
            local_f8[5] = 0;
            local_f8[2] = 0;
            local_f8[3] = 0;
            local_f8[1] = 0;
            local_c8 = 0;
            local_f8[0] = (ulong)*(byte *)&(((SelectedEquality *)
                                            &local_178->
                                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                            )->_inner)._inner.
                                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                           .
                                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                           .
                                           super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                          & 0xffffffffffffff03;
            f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
                       *)local_178;
            f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
                      *)local_f8;
            ::Lib::CoproductImpl::
            RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
            ::
            switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>const&)::_lambda(auto:1)_1_>
                      ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                        *)local_f8,f);
            iVar23 = 1;
            (*((Node *)&pNVar15->_vptr_Node)->_vptr_Node[9])
                      (pNVar15,(RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                                *)local_f8);
          }
          if ((Entry *)local_1a8._stack != (Entry *)0x0) {
            uVar18 = local_1a8._capacity * 8 + 0xf & 0xfffffffffffffff0;
            if (uVar18 == 0) {
              *local_1a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_1a8._stack;
            }
            else if (uVar18 < 0x11) {
              *local_1a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_1a8._stack;
            }
            else if (uVar18 < 0x19) {
              *local_1a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_1a8._stack;
            }
            else if (uVar18 < 0x21) {
              *local_1a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_1a8._stack;
            }
            else if (uVar18 < 0x31) {
              *local_1a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_1a8._stack;
            }
            else if (uVar18 < 0x41) {
              *local_1a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_1a8._stack;
            }
            else {
              operator_delete(local_1a8._stack,0x10);
            }
          }
        }
      }
      leaf_00 = leaf;
    } while (iVar23 == 2);
  }
  return;
code_r0x0037ad20:
  this_01 = (TermList *)(((Entry *)((long)local_1a8._cursor + -0x10))->_val)._content;
  pEVar17 = (Entry *)((long)local_1a8._cursor + -0x10);
  pTVar22 = *(TermList **)((long)local_1a8._cursor + -0x10);
  local_1a8._cursor = (TermList **)pEVar17;
  if ((((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar22 + -1))->_vars & 3) != 2) {
    if (pEVar17 == (Entry *)local_1a8._end) {
      ::Lib::Stack<Kernel::TermList_*>::expand(&local_1a8);
    }
    *local_1a8._cursor = (TermList *)(pTVar22 + -1);
    local_1a8._cursor = (TermList **)((long)local_1a8._cursor + 8);
    pTVar24 = this_01 + -1;
    if (local_1a8._cursor == local_1a8._end) {
      ::Lib::Stack<Kernel::TermList_*>::expand(&local_1a8);
    }
LAB_0037ad87:
    *(uint64_t *)local_1a8._cursor = (uint64_t)pTVar24;
    local_1a8._cursor = local_1a8._cursor + 1;
  }
  goto LAB_0037abbe;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}